

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_add_passphrase.c
# Opt level: O0

int archive_read_add_passphrase(archive *_a,char *passphrase)

{
  int iVar1;
  archive_read_passphrase *p_00;
  int magic_test;
  archive_read_passphrase *p;
  archive_read *a;
  char *passphrase_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_add_passphrase");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else if ((passphrase == (char *)0x0) || (*passphrase == '\0')) {
    archive_set_error(_a,-1,"Empty passphrase is unacceptable");
    _a_local._4_4_ = -0x19;
  }
  else {
    p_00 = new_read_passphrase((archive_read *)_a,passphrase);
    if (p_00 == (archive_read_passphrase *)0x0) {
      _a_local._4_4_ = -0x1e;
    }
    else {
      add_passphrase_to_tail((archive_read *)_a,p_00);
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_add_passphrase(struct archive *_a, const char *passphrase)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_passphrase *p;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
		"archive_read_add_passphrase");

	if (passphrase == NULL || passphrase[0] == '\0') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Empty passphrase is unacceptable");
		return (ARCHIVE_FAILED);
	}

	p = new_read_passphrase(a, passphrase);
	if (p == NULL)
		return (ARCHIVE_FATAL);
	add_passphrase_to_tail(a, p);

	return (ARCHIVE_OK);
}